

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  Builder builder;
  Builder builder_00;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  ReaderFor<capnp::Text> value;
  Client castClient2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:839:38),_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  promise;
  WaitScope waitScope;
  Client client;
  Client castClient;
  Client castClient3;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  request;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_b0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_88;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_28;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::Client(&client,(void *)0x0);
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::callRequest
            (&request,&client,&local_28);
  value.super_StringPtr.content.size_ = 6;
  value.super_StringPtr.content.ptr = "hello";
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::setBaz(&request.super_Builder,value);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::initInnerBound((Builder *)&castClient,&request.super_Builder);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner::Builder::
  initFoo(&local_88,(Builder *)&castClient);
  builder._builder.capTable = local_88._builder.capTable;
  builder._builder.segment = local_88._builder.segment;
  builder._builder.data = local_88._builder.data;
  builder._builder.pointers = local_88._builder.pointers;
  builder._builder.dataSize = local_88._builder.dataSize;
  builder._builder.pointerCount = local_88._builder.pointerCount;
  builder._builder._38_2_ = local_88._builder._38_2_;
  initTestMessage(builder);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::initInnerUnbound((Builder *)&castClient,&request.super_Builder);
  castClient2._vptr_Client = castClient._vptr_Client;
  castClient2._8_8_ = castClient._8_8_;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_b0,(Builder *)&castClient2);
  builder_00._builder.capTable = local_b0._builder.capTable;
  builder_00._builder.segment = local_b0._builder.segment;
  builder_00._builder.data = local_b0._builder.data;
  builder_00._builder.pointers = local_b0._builder.pointers;
  builder_00._builder.dataSize = local_b0._builder.dataSize;
  builder_00._builder.pointerCount = local_b0._builder.pointerCount;
  builder_00._builder._38_2_ = local_b0._builder._38_2_;
  initTestMessage(builder_00);
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::send((Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
          *)&castClient,(int)&request,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&castClient,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:839:38),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:844:6)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00657a80;
  castClient2._vptr_Client =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>,capnp::_::(anonymous_namespace)::TestCase827::run()::$_0,capnp::_::(anonymous_namespace)::TestCase827::run()::$_1>>
        ::instance;
  castClient3._vptr_Client =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>,capnp::_::(anonymous_namespace)::TestCase827::run()::$_0,capnp::_::(anonymous_namespace)::TestCase827::run()::$_1>>
        ::instance;
  castClient2._8_8_ = 0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>,capnp::_::(anonymous_namespace)::TestCase827::run()::$_0,capnp::_::(anonymous_namespace)::TestCase827::run()::$_1>>
        ::instance;
  castClient3._8_8_ = 0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&castClient3);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&castClient2);
  RemotePromise<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
                    *)&castClient);
  kj::Promise<void>::wait(&promise,&waitScope);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::asGeneric<capnp::AnyPointer>
            (&castClient,&client);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::
  asGeneric<capnproto_test::capnp::test::TestAllTypes>(&castClient2,&client);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::Client::
  asTestGenericsGeneric<capnp::AnyPointer,capnp::AnyPointer>(&castClient3,&client);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&castClient3.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&castClient2.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&castClient.field_0x8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, Generics) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  typedef test::TestGenerics<TestAllTypes>::Interface<List<uint32_t>> Interface;
  Interface::Client client = nullptr;

  auto request = client.callRequest();
  request.setBaz("hello");
  initTestMessage(request.initInnerBound().initFoo());
  initTestMessage(request.initInnerUnbound().getFoo().initAs<TestAllTypes>());

  auto promise = request.send().then([](capnp::Response<Interface::CallResults>&& response) {
    // This doesn't actually execute; we're just checking that it compiles.
    List<uint32_t>::Reader qux = response.getQux();
    qux.size();
    checkTestMessage(response.getGen().getFoo());
  }, [](kj::Exception&& e) {
    // Ignore exception (which we'll always get because we're calling a null capability).
  });

  promise.wait(waitScope);

  // Check that asGeneric<>() compiles.
  test::TestGenerics<TestAllTypes>::Interface<>::Client castClient = client.asGeneric<>();
  test::TestGenerics<TestAllTypes>::Interface<TestAllTypes>::Client castClient2 =
      client.asGeneric<TestAllTypes>();
  test::TestGenerics<>::Interface<List<uint32_t>>::Client castClient3 = client.asTestGenericsGeneric<>();
}